

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O3

VerifyDBResult __thiscall
CVerifyDB::VerifyDB(CVerifyDB *this,Chainstate *chainstate,Params *consensus_params,
                   CCoinsView *coinsview,int nCheckLevel,int nCheckDepth)

{
  int *args;
  long lVar1;
  pointer ppCVar2;
  Notifications *pNVar3;
  uint256 *puVar4;
  uchar *puVar5;
  bool bVar6;
  int iVar7;
  DisconnectResult DVar8;
  int iVar9;
  ulong uVar10;
  size_t sVar11;
  CCoinsViewCache *this_00;
  size_t sVar12;
  CBlockIndex *pCVar13;
  uint uVar14;
  CBlockIndex *pCVar15;
  CBlockIndex *pCVar16;
  VerifyDBResult VVar17;
  long in_FS_OFFSET;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  string_view source_file;
  string_view source_file_00;
  string_view source_file_01;
  string_view source_file_02;
  string_view source_file_03;
  string_view source_file_04;
  string_view source_file_05;
  string_view source_file_06;
  string_view source_file_07;
  string_view source_file_08;
  string_view source_file_09;
  string_view source_file_10;
  string_view source_file_11;
  string_view source_file_12;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  string_view logging_function_02;
  string_view logging_function_03;
  string_view logging_function_04;
  string_view logging_function_05;
  string_view logging_function_06;
  string_view logging_function_07;
  string_view logging_function_08;
  string_view logging_function_09;
  string_view logging_function_10;
  string_view logging_function_11;
  string_view logging_function_12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar20;
  undefined7 in_stack_fffffffffffffca8;
  undefined1 in_stack_fffffffffffffcaf;
  byte bVar21;
  int *in_stack_fffffffffffffcb0;
  int *args_1;
  int percentageDone_1;
  int block_count;
  int local_324;
  int nCheckDepth_local;
  int local_31c;
  CBlockUndo undo;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  undefined1 local_2e8 [16];
  string local_2d8;
  undefined1 local_2b8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined1 local_268 [32];
  BlockValidationState state;
  CCoinsViewCache coins;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ppCVar2 = (chainstate->m_chain).vChain.
            super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  uVar10 = (long)ppCVar2 -
           (long)(chainstate->m_chain).vChain.
                 super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
  VVar17 = SUCCESS;
  nCheckDepth_local = nCheckDepth;
  if (((uVar10 != 0) && (pCVar13 = ppCVar2[-1], VVar17 = SUCCESS, pCVar13 != (CBlockIndex *)0x0)) &&
     (pCVar13->pprev != (CBlockIndex *)0x0)) {
    iVar7 = (int)(uVar10 >> 3);
    if ((nCheckDepth < 1) || (iVar7 <= nCheckDepth)) {
      nCheckDepth_local = iVar7 + -1;
    }
    iVar7 = 0;
    if (nCheckLevel < 1) {
      nCheckLevel = 0;
    }
    local_31c = 4;
    if (nCheckLevel < 4) {
      local_31c = nCheckLevel;
    }
    source_file._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp";
    source_file._M_len = 0x57;
    logging_function._M_str = "VerifyDB";
    logging_function._M_len = 8;
    LogPrintf_<int,int>(logging_function,source_file,0x1269,
                        IPC|I2P|VALIDATION|LEVELDB|QT|COINDB|MEMPOOLREJ|PROXY|RAND|REINDEX|
                        SELECTCOINS|RPC|WALLETDB|ZMQ|MEMPOOL|TOR|NET,(Level)&nCheckDepth_local,
                        (char *)&local_31c,
                        (int *)CONCAT17(in_stack_fffffffffffffcaf,in_stack_fffffffffffffca8),
                        in_stack_fffffffffffffcb0);
    CCoinsViewCache::CCoinsViewCache(&coins,coinsview,false);
    local_324 = 0;
    state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p =
         (pointer)&state.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2;
    state.super_ValidationState<BlockValidationResult>.m_mode = M_VALID;
    state.super_ValidationState<BlockValidationResult>.m_result = BLOCK_RESULT_UNSET;
    state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_string_length = 0;
    state.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2._M_local_buf[0] =
         '\0';
    state.super_ValidationState<BlockValidationResult>.m_debug_message._M_dataplus._M_p =
         (pointer)&state.super_ValidationState<BlockValidationResult>.m_debug_message.field_2;
    state.super_ValidationState<BlockValidationResult>.m_debug_message._M_string_length = 0;
    state.super_ValidationState<BlockValidationResult>.m_debug_message.field_2._M_local_buf[0] =
         '\0';
    source_file_00._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp";
    source_file_00._M_len = 0x57;
    logging_function_00._M_str = "VerifyDB";
    logging_function_00._M_len = 8;
    ::LogPrintf_<>(logging_function_00,source_file_00,0x1272,ALL,Info,"Verification progress: 0%%\n"
                  );
    bVar21 = (chainstate->m_from_snapshot_blockhash).super__Optional_base<uint256,_true,_true>.
             _M_payload.super__Optional_payload_base<uint256>._M_engaged;
    pCVar13 = (chainstate->m_chain).vChain.
              super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
              super__Vector_impl_data._M_finish[-1];
    args_1 = (int *)0x0;
    pCVar15 = (CBlockIndex *)0x0;
    do {
      pCVar16 = pCVar15;
      if (pCVar13->pprev == (CBlockIndex *)0x0) goto LAB_00afee73;
      iVar9 = 0x32;
      if (local_31c < 4) {
        iVar9 = 100;
      }
      block_count = (int)((double)iVar9 *
                         ((double)(~pCVar13->nHeight +
                                  (int)((ulong)((long)(chainstate->m_chain).vChain.
                                                                                                            
                                                  super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                               (long)(chainstate->m_chain).vChain.
                                                                                                          
                                                  super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 3))
                         / (double)nCheckDepth_local));
      if (0x62 < block_count) {
        block_count = 99;
      }
      if (block_count < 2) {
        block_count = 1;
      }
      if (iVar7 < (int)((block_count * 0x67 & 0xffffU) >> 10)) {
        source_file_01._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
        ;
        source_file_01._M_len = 0x57;
        logging_function_01._M_str = "VerifyDB";
        logging_function_01._M_len = 8;
        LogPrintf_<int>(logging_function_01,source_file_01,0x127a,ALL,Info,
                        "Verification progress: %d%%\n",&block_count);
        iVar7 = block_count / 10;
      }
      pNVar3 = this->m_notifications;
      local_2b8._0_8_ = local_2b8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_2b8,anon_var_dwarf_2c07026,anon_var_dwarf_2c07026 + 0x13);
      if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0) {
        local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_298,anon_var_dwarf_2c07026,anon_var_dwarf_2c07026 + 0x13);
      }
      else {
        local_2d8._M_dataplus._M_p = anon_var_dwarf_2c07026;
        (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
                  (&local_298,(_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,(char **)&local_2d8);
      }
      (*pNVar3->_vptr_Notifications[4])(pNVar3,local_2b8,(ulong)(uint)block_count,0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298._M_dataplus._M_p != &local_298.field_2) {
        operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_2b8._0_8_ != local_2b8 + 0x10) {
        operator_delete((void *)local_2b8._0_8_,local_2b8._16_8_ + 1);
      }
      args = &pCVar13->nHeight;
      if (*args <= ~nCheckDepth_local +
                   (int)((ulong)((long)(chainstate->m_chain).vChain.
                                       super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(chainstate->m_chain).vChain.
                                      super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>
                                      ._M_impl.super__Vector_impl_data._M_start) >> 3))
      goto LAB_00afee73;
      if (((chainstate->m_blockman->m_prune_mode | bVar21) == 1) && ((pCVar13->nStatus & 8) == 0)) {
        VVar17 = SKIPPED_MISSING_BLOCKS;
        source_file_08._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
        ;
        source_file_08._M_len = 0x57;
        logging_function_08._M_str = "VerifyDB";
        logging_function_08._M_len = 8;
        LogPrintf_<int>(logging_function_08,source_file_08,0x1284,ALL,Info,
                        "VerifyDB(): block verification stopping at height %d (no data). This could be due to pruning or use of an assumeutxo snapshot.\n"
                        ,args);
        goto LAB_00afee76;
      }
      local_268._16_3_ = 0;
      local_268._19_8_ = 0;
      local_268._0_8_ = (pointer)0x0;
      local_268._8_3_ = 0;
      local_268._11_5_ = 0;
      local_278._0_1_ = '\0';
      local_278._1_1_ = '\0';
      local_278._2_1_ = '\0';
      local_278._3_1_ = '\0';
      local_278._4_4_ = 0;
      uStack_270._0_4_ = 0;
      uStack_270._4_4_ = 0;
      local_298.field_2._M_allocated_capacity = 0;
      local_298.field_2._8_8_ = 0;
      local_298._M_dataplus._M_p = (pointer)0x0;
      local_298._M_string_length = 0;
      local_2b8._16_8_ = 0;
      local_2b8[0x18] = '\0';
      local_2b8[0x19] = '\0';
      local_2b8[0x1a] = '\0';
      local_2b8[0x1b] = '\0';
      local_2b8[0x1c] = '\0';
      local_2b8[0x1d] = '\0';
      local_2b8[0x1e] = '\0';
      local_2b8[0x1f] = '\0';
      local_2b8._0_8_ = (undefined1 *)0x0;
      local_2b8[8] = '\0';
      local_2b8[9] = '\0';
      local_2b8[10] = '\0';
      local_2b8[0xb] = '\0';
      local_2b8[0xc] = '\0';
      local_2b8[0xd] = '\0';
      local_2b8[0xe] = '\0';
      local_2b8[0xf] = '\0';
      bVar6 = ::node::BlockManager::ReadBlockFromDisk
                        (chainstate->m_blockman,(CBlock *)local_2b8,pCVar13);
      if (!bVar6) {
        puVar4 = pCVar13->phashBlock;
        if (puVar4 == (uint256 *)0x0) goto LAB_00aff726;
        local_2f8 = *(undefined8 *)(puVar4->super_base_blob<256U>).m_data._M_elems;
        uStack_2f0 = *(undefined8 *)((puVar4->super_base_blob<256U>).m_data._M_elems + 8);
        local_2e8 = *(undefined1 (*) [16])((puVar4->super_base_blob<256U>).m_data._M_elems + 0x10);
        pbVar20 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xafefc6;
        base_blob<256u>::ToString_abi_cxx11_(&local_2d8,&local_2f8);
        source_file_05._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
        ;
        source_file_05._M_len = 0x57;
        logging_function_05._M_str = "VerifyDB";
        logging_function_05._M_len = 8;
        LogPrintf_<int,std::__cxx11::string>
                  (logging_function_05,source_file_05,0x128b,TOR,0xfdadc6,(char *)args,
                   (int *)&local_2d8,pbVar20);
LAB_00aff5e5:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
          operator_delete(local_2d8._M_dataplus._M_p,
                          CONCAT17(local_2d8.field_2._M_local_buf[7],
                                   CONCAT16(local_2d8.field_2._M_local_buf[6],
                                            CONCAT15(local_2d8.field_2._M_local_buf[5],
                                                     CONCAT14(local_2d8.field_2._M_local_buf[4],
                                                              CONCAT13(local_2d8.field_2.
                                                                       _M_local_buf[3],
                                                                       CONCAT12(local_2d8.field_2.
                                                                                _M_local_buf[2],
                                                                                CONCAT11(local_2d8.
                                                                                         field_2.
                                                  _M_local_buf[1],local_2d8.field_2._M_local_buf[0])
                                                  )))))) + 1);
        }
LAB_00aff606:
        VVar17 = CORRUPTED_BLOCK_DB;
LAB_00aff60c:
        std::
        vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
        ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                   *)local_268);
        goto LAB_00aff619;
      }
      if (local_31c < 1) goto LAB_00afed46;
      bVar6 = CheckBlock((CBlock *)local_2b8,&state,consensus_params,true,true);
      if (!bVar6) {
        puVar4 = pCVar13->phashBlock;
        if (puVar4 != (uint256 *)0x0) {
          local_2f8 = *(undefined8 *)(puVar4->super_base_blob<256U>).m_data._M_elems;
          uStack_2f0 = *(undefined8 *)((puVar4->super_base_blob<256U>).m_data._M_elems + 8);
          local_2e8 = *(undefined1 (*) [16])((puVar4->super_base_blob<256U>).m_data._M_elems + 0x10)
          ;
          base_blob<256u>::ToString_abi_cxx11_(&local_2d8,&local_2f8);
          pbVar20 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xaff2e6;
          ValidationState<BlockValidationResult>::ToString_abi_cxx11_
                    ((string *)&undo,&state.super_ValidationState<BlockValidationResult>);
          source_file_07._M_str =
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
          ;
          source_file_07._M_len = 0x57;
          logging_function_07._M_str = "VerifyDB";
          logging_function_07._M_len = 8;
          LogPrintf_<int,std::__cxx11::string,std::__cxx11::string>
                    (logging_function_07,source_file_07,0x1291,
                     IPC|I2P|VALIDATION|LEVELDB|QT|COINDB|MEMPOOLREJ|PROXY|RAND|REINDEX|SELECTCOINS|
                     ADDRMAN|TOR|NET,(Level)args,(char *)&local_2d8,(int *)&undo,pbVar20,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(bVar21,in_stack_fffffffffffffca8));
          if (undo.vtxundo.super__Vector_base<CTxUndo,_std::allocator<CTxUndo>_>._M_impl.
              super__Vector_impl_data._M_start !=
              (pointer)&undo.vtxundo.super__Vector_base<CTxUndo,_std::allocator<CTxUndo>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage) {
            operator_delete(undo.vtxundo.super__Vector_base<CTxUndo,_std::allocator<CTxUndo>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (ulong)((long)&((undo.vtxundo.
                                             super__Vector_base<CTxUndo,_std::allocator<CTxUndo>_>.
                                             _M_impl.super__Vector_impl_data._M_end_of_storage)->
                                           vprevout).super__Vector_base<Coin,_std::allocator<Coin>_>
                                           ._M_impl.super__Vector_impl_data._M_start + 1));
          }
          goto LAB_00aff5e5;
        }
        goto LAB_00aff726;
      }
      if (1 < local_31c) {
        undo.vtxundo.super__Vector_base<CTxUndo,_std::allocator<CTxUndo>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        undo.vtxundo.super__Vector_base<CTxUndo,_std::allocator<CTxUndo>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        undo.vtxundo.super__Vector_base<CTxUndo,_std::allocator<CTxUndo>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        if ((((pCVar13->nStatus & 0x10) == 0) || (pCVar13->nFile == -1)) ||
           (bVar6 = ::node::BlockManager::UndoReadFromDisk(chainstate->m_blockman,&undo,pCVar13),
           bVar6)) {
          std::vector<CTxUndo,_std::allocator<CTxUndo>_>::~vector(&undo.vtxundo);
          goto LAB_00afed46;
        }
        puVar4 = pCVar13->phashBlock;
        if (puVar4 != (uint256 *)0x0) {
          local_2f8 = *(undefined8 *)(puVar4->super_base_blob<256U>).m_data._M_elems;
          uStack_2f0 = *(undefined8 *)((puVar4->super_base_blob<256U>).m_data._M_elems + 8);
          local_2e8 = *(undefined1 (*) [16])((puVar4->super_base_blob<256U>).m_data._M_elems + 0x10)
          ;
          pbVar20 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xaff509;
          base_blob<256u>::ToString_abi_cxx11_(&local_2d8,&local_2f8);
          source_file_11._M_str =
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
          ;
          source_file_11._M_len = 0x57;
          logging_function_11._M_str = "VerifyDB";
          logging_function_11._M_len = 8;
          LogPrintf_<int,std::__cxx11::string>
                    (logging_function_11,source_file_11,0x1299,TOR,0xfdae3c,(char *)args,
                     (int *)&local_2d8,pbVar20);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
            operator_delete(local_2d8._M_dataplus._M_p,
                            CONCAT17(local_2d8.field_2._M_local_buf[7],
                                     CONCAT16(local_2d8.field_2._M_local_buf[6],
                                              CONCAT15(local_2d8.field_2._M_local_buf[5],
                                                       CONCAT14(local_2d8.field_2._M_local_buf[4],
                                                                CONCAT13(local_2d8.field_2.
                                                                         _M_local_buf[3],
                                                                         CONCAT12(local_2d8.field_2.
                                                                                  _M_local_buf[2],
                                                                                  CONCAT11(local_2d8
                                                  .field_2._M_local_buf[1],
                                                  local_2d8.field_2._M_local_buf[0]))))))) + 1);
          }
          std::vector<CTxUndo,_std::allocator<CTxUndo>_>::~vector(&undo.vtxundo);
          goto LAB_00aff606;
        }
        goto LAB_00aff726;
      }
LAB_00afed46:
      sVar11 = CCoinsViewCache::DynamicMemoryUsage(&coins);
      this_00 = Chainstate::CoinsTip(chainstate);
      sVar12 = CCoinsViewCache::DynamicMemoryUsage(this_00);
      iVar9 = local_324;
      if (2 < local_31c) {
        if (chainstate->m_coinstip_cache_size_bytes < sVar12 + sVar11) {
          args_1 = (int *)CONCAT71((int7)(sVar12 + sVar11 >> 8),1);
        }
        else {
          CCoinsViewCache::GetBestBlock((uint256 *)&local_2d8,&coins);
          puVar4 = pCVar13->phashBlock;
          if (puVar4 == (uint256 *)0x0) goto LAB_00aff726;
          local_2f8 = *(undefined8 *)(puVar4->super_base_blob<256U>).m_data._M_elems;
          puVar5 = (puVar4->super_base_blob<256U>).m_data._M_elems + 8;
          uStack_2f0 = *(undefined8 *)puVar5;
          local_2e8 = *(undefined1 (*) [16])((puVar4->super_base_blob<256U>).m_data._M_elems + 0x10)
          ;
          auVar19[0] = -(local_2d8.field_2._M_local_buf[0] == local_2e8[0]);
          auVar19[1] = -(local_2d8.field_2._M_local_buf[1] == local_2e8[1]);
          auVar19[2] = -(local_2d8.field_2._M_local_buf[2] == local_2e8[2]);
          auVar19[3] = -(local_2d8.field_2._M_local_buf[3] == local_2e8[3]);
          auVar19[4] = -(local_2d8.field_2._M_local_buf[4] == local_2e8[4]);
          auVar19[5] = -(local_2d8.field_2._M_local_buf[5] == local_2e8[5]);
          auVar19[6] = -(local_2d8.field_2._M_local_buf[6] == local_2e8[6]);
          auVar19[7] = -(local_2d8.field_2._M_local_buf[7] == local_2e8[7]);
          auVar19[8] = -(local_2d8.field_2._M_local_buf[8] == local_2e8[8]);
          auVar19[9] = -(local_2d8.field_2._M_local_buf[9] == local_2e8[9]);
          auVar19[10] = -(local_2d8.field_2._M_local_buf[10] == local_2e8[10]);
          auVar19[0xb] = -(local_2d8.field_2._M_local_buf[0xb] == local_2e8[0xb]);
          auVar19[0xc] = -(local_2d8.field_2._M_local_buf[0xc] == local_2e8[0xc]);
          auVar19[0xd] = -(local_2d8.field_2._M_local_buf[0xd] == local_2e8[0xd]);
          auVar19[0xe] = -(local_2d8.field_2._M_local_buf[0xe] == local_2e8[0xe]);
          auVar19[0xf] = -(local_2d8.field_2._M_local_buf[0xf] == local_2e8[0xf]);
          auVar18[0] = -((uchar)local_2d8._M_dataplus._M_p ==
                        (puVar4->super_base_blob<256U>).m_data._M_elems[0]);
          auVar18[1] = -(local_2d8._M_dataplus._M_p._1_1_ ==
                        (puVar4->super_base_blob<256U>).m_data._M_elems[1]);
          auVar18[2] = -(local_2d8._M_dataplus._M_p._2_1_ ==
                        (puVar4->super_base_blob<256U>).m_data._M_elems[2]);
          auVar18[3] = -(local_2d8._M_dataplus._M_p._3_1_ ==
                        (puVar4->super_base_blob<256U>).m_data._M_elems[3]);
          auVar18[4] = -(local_2d8._M_dataplus._M_p._4_1_ ==
                        (puVar4->super_base_blob<256U>).m_data._M_elems[4]);
          auVar18[5] = -(local_2d8._M_dataplus._M_p._5_1_ ==
                        (puVar4->super_base_blob<256U>).m_data._M_elems[5]);
          auVar18[6] = -(local_2d8._M_dataplus._M_p._6_1_ ==
                        (puVar4->super_base_blob<256U>).m_data._M_elems[6]);
          auVar18[7] = -(local_2d8._M_dataplus._M_p._7_1_ ==
                        (puVar4->super_base_blob<256U>).m_data._M_elems[7]);
          auVar18[8] = -((uchar)local_2d8._M_string_length == *puVar5);
          auVar18[9] = -(local_2d8._M_string_length._1_1_ ==
                        (puVar4->super_base_blob<256U>).m_data._M_elems[9]);
          auVar18[10] = -(local_2d8._M_string_length._2_1_ ==
                         (puVar4->super_base_blob<256U>).m_data._M_elems[10]);
          auVar18[0xb] = -(local_2d8._M_string_length._3_1_ ==
                          (puVar4->super_base_blob<256U>).m_data._M_elems[0xb]);
          auVar18[0xc] = -(local_2d8._M_string_length._4_1_ ==
                          (puVar4->super_base_blob<256U>).m_data._M_elems[0xc]);
          auVar18[0xd] = -(local_2d8._M_string_length._5_1_ ==
                          (puVar4->super_base_blob<256U>).m_data._M_elems[0xd]);
          auVar18[0xe] = -(local_2d8._M_string_length._6_1_ ==
                          (puVar4->super_base_blob<256U>).m_data._M_elems[0xe]);
          auVar18[0xf] = -(local_2d8._M_string_length._7_1_ ==
                          (puVar4->super_base_blob<256U>).m_data._M_elems[0xf]);
          auVar18 = auVar18 & auVar19;
          if ((ushort)((ushort)(SUB161(auVar18 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar18 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar18 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar18 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar18 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar18 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar18 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar18 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar18 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar18 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar18 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar18 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar18 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar18 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar18 >> 0x77,0) & 1) << 0xe |
                      (ushort)(byte)(auVar18[0xf] >> 7) << 0xf) != 0xffff) {
            __assert_fail("coins.GetBestBlock() == pindex->GetBlockHash()",
                          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
                          ,0x12a3,
                          "VerifyDBResult CVerifyDB::VerifyDB(Chainstate &, const Consensus::Params &, CCoinsView &, int, int)"
                         );
          }
          DVar8 = Chainstate::DisconnectBlock(chainstate,(CBlock *)local_2b8,pCVar13,&coins);
          pCVar16 = pCVar13;
          iVar9 = 0;
          if (DVar8 != DISCONNECT_UNCLEAN) {
            if (DVar8 == DISCONNECT_FAILED) {
              puVar4 = pCVar13->phashBlock;
              if (puVar4 != (uint256 *)0x0) {
                local_2f8 = *(undefined8 *)(puVar4->super_base_blob<256U>).m_data._M_elems;
                uStack_2f0 = *(undefined8 *)((puVar4->super_base_blob<256U>).m_data._M_elems + 8);
                local_2e8 = *(undefined1 (*) [16])
                             ((puVar4->super_base_blob<256U>).m_data._M_elems + 0x10);
                pbVar20 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          0xaff5a9;
                base_blob<256u>::ToString_abi_cxx11_(&local_2d8,&local_2f8);
                source_file_12._M_str =
                     "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
                ;
                source_file_12._M_len = 0x57;
                logging_function_12._M_str = "VerifyDB";
                logging_function_12._M_len = 8;
                LogPrintf_<int,std::__cxx11::string>
                          (logging_function_12,source_file_12,0x12a6,TOR,0xfdaf07,(char *)args,
                           (int *)&local_2d8,pbVar20);
                goto LAB_00aff5e5;
              }
              goto LAB_00aff726;
            }
            pCVar16 = pCVar15;
            iVar9 = (int)((ulong)(CONCAT53(local_268._11_5_,local_268._8_3_) - local_268._0_8_) >> 4
                         ) + local_324;
          }
        }
      }
      local_324 = iVar9;
      bVar6 = util::SignalInterrupt::operator_cast_to_bool(chainstate->m_chainman->m_interrupt);
      if (bVar6) {
        VVar17 = INTERRUPTED;
        goto LAB_00aff60c;
      }
      std::
      vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
      ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                 *)local_268);
      pCVar13 = pCVar13->pprev;
      pCVar15 = pCVar16;
    } while (pCVar13 != (CBlockIndex *)0x0);
    pCVar13 = (CBlockIndex *)0x0;
LAB_00afee73:
    VVar17 = SUCCESS;
    pCVar15 = pCVar16;
LAB_00afee76:
    if (pCVar15 == (CBlockIndex *)0x0) {
      if (((ulong)args_1 & 1) != 0) {
        source_file_03._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
        ;
        source_file_03._M_len = 0x57;
        logging_function_03._M_str = "VerifyDB";
        logging_function_03._M_len = 8;
        ::LogPrintf_<>(logging_function_03,source_file_03,0x12ba,ALL,Info,
                       "Skipped verification of level >=3 (insufficient database cache size). Consider increasing -dbcache.\n"
                      );
      }
      block_count = ~pCVar13->nHeight +
                    (int)((ulong)((long)(chainstate->m_chain).vChain.
                                        super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(chainstate->m_chain).vChain.
                                       super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>
                                       ._M_impl.super__Vector_impl_data._M_start) >> 3);
      if (local_31c < 4 || ((ulong)args_1 & 1) != 0) {
LAB_00afef45:
        source_file_04._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
        ;
        source_file_04._M_len = 0x57;
        logging_function_04._M_str = "VerifyDB";
        logging_function_04._M_len = 8;
        LogPrintf_<int,int>(logging_function_04,source_file_04,0x12d8,
                            IPC|I2P|VALIDATION|LEVELDB|QT|COINDB|MEMPOOLREJ|PROXY|RAND|CMPCTBLOCK|
                            WALLETDB|ZMQ|HTTP|NET,(Level)&block_count,(char *)&local_324,
                            (int *)CONCAT17(bVar21,in_stack_fffffffffffffca8),args_1);
        if (((ulong)args_1 & 1) != 0) {
          VVar17 = SKIPPED_L3_CHECKS;
        }
      }
      else {
        do {
          ppCVar2 = (chainstate->m_chain).vChain.
                    super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
          uVar10 = (long)ppCVar2 -
                   (long)(chainstate->m_chain).vChain.
                         super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                         super__Vector_impl_data._M_start;
          if (uVar10 == 0) {
            pCVar15 = (CBlockIndex *)0x0;
          }
          else {
            pCVar15 = ppCVar2[-1];
          }
          if (pCVar13 == pCVar15) goto LAB_00afef45;
          iVar9 = (int)(((double)(~pCVar13->nHeight + (int)(uVar10 >> 3)) /
                        (double)nCheckDepth_local) * 50.0);
          uVar14 = 100 - iVar9;
          uVar10 = (ulong)uVar14;
          if ((int)uVar14 < 2) {
            uVar10 = 1;
          }
          if (iVar9 < 2) {
            uVar10 = 99;
          }
          percentageDone_1 = (int)uVar10;
          if (iVar7 < (int)(uint)(uVar10 * 0x66666667 >> 0x22)) {
            source_file_06._M_str =
                 "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
            ;
            source_file_06._M_len = 0x57;
            logging_function_06._M_str = "VerifyDB";
            logging_function_06._M_len = 8;
            LogPrintf_<int>(logging_function_06,source_file_06,0x12c6,ALL,Info,
                            "Verification progress: %d%%\n",&percentageDone_1);
            iVar7 = percentageDone_1 / 10;
          }
          pNVar3 = this->m_notifications;
          local_2b8._0_8_ = local_2b8 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_2b8,anon_var_dwarf_2c07026,anon_var_dwarf_2c07026 + 0x13);
          if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0) {
            local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_298,anon_var_dwarf_2c07026,anon_var_dwarf_2c07026 + 0x13);
          }
          else {
            local_2d8._M_dataplus._M_p = anon_var_dwarf_2c07026;
            (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
                      (&local_298,(_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,(char **)&local_2d8);
          }
          (*pNVar3->_vptr_Notifications[4])
                    (pNVar3,(CBlock *)local_2b8,(ulong)(uint)percentageDone_1,0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_298._M_dataplus._M_p != &local_298.field_2) {
            operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
          }
          if ((undefined1 *)local_2b8._0_8_ != local_2b8 + 0x10) {
            operator_delete((void *)local_2b8._0_8_,local_2b8._16_8_ + 1);
          }
          pCVar13 = CChain::Next(&chainstate->m_chain,pCVar13);
          local_268._16_3_ = 0;
          local_268._19_8_ = 0;
          local_268._0_8_ = (pointer)0x0;
          local_268._8_3_ = 0;
          local_268._11_5_ = 0;
          local_278._0_1_ = '\0';
          local_278._1_1_ = '\0';
          local_278._2_1_ = '\0';
          local_278._3_1_ = '\0';
          local_278._4_4_ = 0;
          uStack_270._0_4_ = 0;
          uStack_270._4_4_ = 0;
          local_298.field_2._M_allocated_capacity = 0;
          local_298.field_2._8_8_ = 0;
          local_298._M_dataplus._M_p = (pointer)0x0;
          local_298._M_string_length = 0;
          local_2b8._16_8_ = 0;
          local_2b8[0x18] = '\0';
          local_2b8[0x19] = '\0';
          local_2b8[0x1a] = '\0';
          local_2b8[0x1b] = '\0';
          local_2b8[0x1c] = '\0';
          local_2b8[0x1d] = '\0';
          local_2b8[0x1e] = '\0';
          local_2b8[0x1f] = '\0';
          local_2b8._0_8_ = (undefined1 *)0x0;
          local_2b8[8] = '\0';
          local_2b8[9] = '\0';
          local_2b8[10] = '\0';
          local_2b8[0xb] = '\0';
          local_2b8[0xc] = '\0';
          local_2b8[0xd] = '\0';
          local_2b8[0xe] = '\0';
          local_2b8[0xf] = '\0';
          bVar6 = ::node::BlockManager::ReadBlockFromDisk
                            (chainstate->m_blockman,(CBlock *)local_2b8,pCVar13);
          if (!bVar6) {
            puVar4 = pCVar13->phashBlock;
            if (puVar4 == (uint256 *)0x0) {
LAB_00aff726:
              __assert_fail("phashBlock != nullptr",
                            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/chain.h"
                            ,0xf5,"uint256 CBlockIndex::GetBlockHash() const");
            }
            local_2f8 = *(undefined8 *)(puVar4->super_base_blob<256U>).m_data._M_elems;
            uStack_2f0 = *(undefined8 *)((puVar4->super_base_blob<256U>).m_data._M_elems + 8);
            local_2e8 = *(undefined1 (*) [16])
                         ((puVar4->super_base_blob<256U>).m_data._M_elems + 0x10);
            pbVar20 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xaff3be;
            base_blob<256u>::ToString_abi_cxx11_(&local_2d8,&local_2f8);
            source_file_09._M_str =
                 "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
            ;
            source_file_09._M_len = 0x57;
            logging_function_09._M_str = "VerifyDB";
            logging_function_09._M_len = 8;
            LogPrintf_<int,std::__cxx11::string>
                      (logging_function_09,source_file_09,0x12cd,TOR,0xfdadc6,
                       (char *)&pCVar13->nHeight,(int *)&local_2d8,pbVar20);
LAB_00aff4a2:
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
              operator_delete(local_2d8._M_dataplus._M_p,
                              CONCAT17(local_2d8.field_2._M_local_buf[7],
                                       CONCAT16(local_2d8.field_2._M_local_buf[6],
                                                CONCAT15(local_2d8.field_2._M_local_buf[5],
                                                         CONCAT14(local_2d8.field_2._M_local_buf[4],
                                                                  CONCAT13(local_2d8.field_2.
                                                                           _M_local_buf[3],
                                                                           CONCAT12(local_2d8.
                                                                                    field_2.
                                                  _M_local_buf[2],
                                                  CONCAT11(local_2d8.field_2._M_local_buf[1],
                                                           local_2d8.field_2._M_local_buf[0])))))))
                              + 1);
            }
            std::
            vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                       *)local_268);
            goto LAB_00afeece;
          }
          bVar6 = Chainstate::ConnectBlock
                            (chainstate,(CBlock *)local_2b8,&state,pCVar13,&coins,false);
          if (!bVar6) {
            puVar4 = pCVar13->phashBlock;
            if (puVar4 != (uint256 *)0x0) {
              local_2f8 = *(undefined8 *)(puVar4->super_base_blob<256U>).m_data._M_elems;
              uStack_2f0 = *(undefined8 *)((puVar4->super_base_blob<256U>).m_data._M_elems + 8);
              local_2e8 = *(undefined1 (*) [16])
                           ((puVar4->super_base_blob<256U>).m_data._M_elems + 0x10);
              base_blob<256u>::ToString_abi_cxx11_(&local_2d8,&local_2f8);
              pbVar20 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        0xaff44c;
              ValidationState<BlockValidationResult>::ToString_abi_cxx11_
                        ((string *)&undo,&state.super_ValidationState<BlockValidationResult>);
              source_file_10._M_str =
                   "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
              ;
              source_file_10._M_len = 0x57;
              logging_function_10._M_str = "VerifyDB";
              logging_function_10._M_len = 8;
              LogPrintf_<int,std::__cxx11::string,std::__cxx11::string>
                        (logging_function_10,source_file_10,0x12d1,
                         IPC|I2P|VALIDATION|LEVELDB|QT|COINDB|MEMPOOLREJ|PROXY|RAND|CMPCTBLOCK|ZMQ|
                         MEMPOOL|TOR,(int)pCVar13 + 0x18,(char *)&local_2d8,(int *)&undo,pbVar20,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT17(bVar21,in_stack_fffffffffffffca8));
              if (undo.vtxundo.super__Vector_base<CTxUndo,_std::allocator<CTxUndo>_>._M_impl.
                  super__Vector_impl_data._M_start !=
                  (pointer)&undo.vtxundo.super__Vector_base<CTxUndo,_std::allocator<CTxUndo>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage) {
                operator_delete(undo.vtxundo.super__Vector_base<CTxUndo,_std::allocator<CTxUndo>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (ulong)((long)&((undo.vtxundo.
                                                 super__Vector_base<CTxUndo,_std::allocator<CTxUndo>_>
                                                 ._M_impl.super__Vector_impl_data._M_end_of_storage)
                                               ->vprevout).
                                               super__Vector_base<Coin,_std::allocator<Coin>_>.
                                               _M_impl.super__Vector_impl_data._M_start + 1));
              }
              goto LAB_00aff4a2;
            }
            goto LAB_00aff726;
          }
          bVar6 = util::SignalInterrupt::operator_cast_to_bool(chainstate->m_chainman->m_interrupt);
          std::
          vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
          ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                     *)local_268);
        } while (!bVar6);
        VVar17 = INTERRUPTED;
      }
    }
    else {
      local_2b8._0_4_ =
           (int)((ulong)((long)(chainstate->m_chain).vChain.
                               super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                        (long)(chainstate->m_chain).vChain.
                              super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
                              _M_impl.super__Vector_impl_data._M_start) >> 3) - pCVar15->nHeight;
      source_file_02._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
      ;
      source_file_02._M_len = 0x57;
      logging_function_02._M_str = "VerifyDB";
      logging_function_02._M_len = 8;
      LogPrintf_<int,int>(logging_function_02,source_file_02,0x12b6,
                          IPC|I2P|VALIDATION|LEVELDB|QT|COINDB|MEMPOOLREJ|PROXY|RAND|REINDEX|
                          SELECTCOINS|ADDRMAN|ESTIMATEFEE|WALLETDB|BENCH|MEMPOOL|NET,
                          (Level)local_2b8,(char *)&local_324,
                          (int *)CONCAT17(bVar21,in_stack_fffffffffffffca8),args_1);
LAB_00afeece:
      VVar17 = CORRUPTED_BLOCK_DB;
    }
LAB_00aff619:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)state.super_ValidationState<BlockValidationResult>.m_debug_message._M_dataplus._M_p !=
        &state.super_ValidationState<BlockValidationResult>.m_debug_message.field_2) {
      operator_delete(state.super_ValidationState<BlockValidationResult>.m_debug_message._M_dataplus
                      ._M_p,CONCAT71(state.super_ValidationState<BlockValidationResult>.
                                     m_debug_message.field_2._M_allocated_capacity._1_7_,
                                     state.super_ValidationState<BlockValidationResult>.
                                     m_debug_message.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p !=
        &state.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2) {
      operator_delete(state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus
                      ._M_p,CONCAT71(state.super_ValidationState<BlockValidationResult>.
                                     m_reject_reason.field_2._M_allocated_capacity._1_7_,
                                     state.super_ValidationState<BlockValidationResult>.
                                     m_reject_reason.field_2._M_local_buf[0]) + 1);
    }
    coins.super_CCoinsViewBacked.super_CCoinsView._vptr_CCoinsView =
         (_func_int **)&PTR_GetCoin_013bd500;
    std::
    _Hashtable<COutPoint,_std::pair<const_COutPoint,_CCoinsCacheEntry>,_PoolAllocator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_144UL,_8UL>,_std::__detail::_Select1st,_std::equal_to<COutPoint>,_SaltedOutpointHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(&coins.cacheCoins._M_h);
    if (coins.m_sentinel.second.m_flags != '\0') {
      ((coins.m_sentinel.second.m_next)->second).m_prev = coins.m_sentinel.second.m_prev;
      ((coins.m_sentinel.second.m_prev)->second).m_next = coins.m_sentinel.second.m_next;
      coins.m_sentinel.second.m_flags = '\0';
    }
    if (0x1c < coins.m_sentinel.second.coin.out.scriptPubKey.super_CScriptBase._size) {
      free(coins.m_sentinel.second.coin.out.scriptPubKey.super_CScriptBase._union.indirect_contents.
           indirect);
      coins.m_sentinel.second.coin.out.scriptPubKey.super_CScriptBase._union.indirect_contents.
      indirect = (char *)0x0;
    }
    PoolResource<144UL,_8UL>::~PoolResource(&coins.m_cache_coins_memory_resource);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return VVar17;
}

Assistant:

VerifyDBResult CVerifyDB::VerifyDB(
    Chainstate& chainstate,
    const Consensus::Params& consensus_params,
    CCoinsView& coinsview,
    int nCheckLevel, int nCheckDepth)
{
    AssertLockHeld(cs_main);

    if (chainstate.m_chain.Tip() == nullptr || chainstate.m_chain.Tip()->pprev == nullptr) {
        return VerifyDBResult::SUCCESS;
    }

    // Verify blocks in the best chain
    if (nCheckDepth <= 0 || nCheckDepth > chainstate.m_chain.Height()) {
        nCheckDepth = chainstate.m_chain.Height();
    }
    nCheckLevel = std::max(0, std::min(4, nCheckLevel));
    LogPrintf("Verifying last %i blocks at level %i\n", nCheckDepth, nCheckLevel);
    CCoinsViewCache coins(&coinsview);
    CBlockIndex* pindex;
    CBlockIndex* pindexFailure = nullptr;
    int nGoodTransactions = 0;
    BlockValidationState state;
    int reportDone = 0;
    bool skipped_no_block_data{false};
    bool skipped_l3_checks{false};
    LogPrintf("Verification progress: 0%%\n");

    const bool is_snapshot_cs{chainstate.m_from_snapshot_blockhash};

    for (pindex = chainstate.m_chain.Tip(); pindex && pindex->pprev; pindex = pindex->pprev) {
        const int percentageDone = std::max(1, std::min(99, (int)(((double)(chainstate.m_chain.Height() - pindex->nHeight)) / (double)nCheckDepth * (nCheckLevel >= 4 ? 50 : 100))));
        if (reportDone < percentageDone / 10) {
            // report every 10% step
            LogPrintf("Verification progress: %d%%\n", percentageDone);
            reportDone = percentageDone / 10;
        }
        m_notifications.progress(_("Verifying blocks…"), percentageDone, false);
        if (pindex->nHeight <= chainstate.m_chain.Height() - nCheckDepth) {
            break;
        }
        if ((chainstate.m_blockman.IsPruneMode() || is_snapshot_cs) && !(pindex->nStatus & BLOCK_HAVE_DATA)) {
            // If pruning or running under an assumeutxo snapshot, only go
            // back as far as we have data.
            LogPrintf("VerifyDB(): block verification stopping at height %d (no data). This could be due to pruning or use of an assumeutxo snapshot.\n", pindex->nHeight);
            skipped_no_block_data = true;
            break;
        }
        CBlock block;
        // check level 0: read from disk
        if (!chainstate.m_blockman.ReadBlockFromDisk(block, *pindex)) {
            LogPrintf("Verification error: ReadBlockFromDisk failed at %d, hash=%s\n", pindex->nHeight, pindex->GetBlockHash().ToString());
            return VerifyDBResult::CORRUPTED_BLOCK_DB;
        }
        // check level 1: verify block validity
        if (nCheckLevel >= 1 && !CheckBlock(block, state, consensus_params)) {
            LogPrintf("Verification error: found bad block at %d, hash=%s (%s)\n",
                      pindex->nHeight, pindex->GetBlockHash().ToString(), state.ToString());
            return VerifyDBResult::CORRUPTED_BLOCK_DB;
        }
        // check level 2: verify undo validity
        if (nCheckLevel >= 2 && pindex) {
            CBlockUndo undo;
            if (!pindex->GetUndoPos().IsNull()) {
                if (!chainstate.m_blockman.UndoReadFromDisk(undo, *pindex)) {
                    LogPrintf("Verification error: found bad undo data at %d, hash=%s\n", pindex->nHeight, pindex->GetBlockHash().ToString());
                    return VerifyDBResult::CORRUPTED_BLOCK_DB;
                }
            }
        }
        // check level 3: check for inconsistencies during memory-only disconnect of tip blocks
        size_t curr_coins_usage = coins.DynamicMemoryUsage() + chainstate.CoinsTip().DynamicMemoryUsage();

        if (nCheckLevel >= 3) {
            if (curr_coins_usage <= chainstate.m_coinstip_cache_size_bytes) {
                assert(coins.GetBestBlock() == pindex->GetBlockHash());
                DisconnectResult res = chainstate.DisconnectBlock(block, pindex, coins);
                if (res == DISCONNECT_FAILED) {
                    LogPrintf("Verification error: irrecoverable inconsistency in block data at %d, hash=%s\n", pindex->nHeight, pindex->GetBlockHash().ToString());
                    return VerifyDBResult::CORRUPTED_BLOCK_DB;
                }
                if (res == DISCONNECT_UNCLEAN) {
                    nGoodTransactions = 0;
                    pindexFailure = pindex;
                } else {
                    nGoodTransactions += block.vtx.size();
                }
            } else {
                skipped_l3_checks = true;
            }
        }
        if (chainstate.m_chainman.m_interrupt) return VerifyDBResult::INTERRUPTED;
    }
    if (pindexFailure) {
        LogPrintf("Verification error: coin database inconsistencies found (last %i blocks, %i good transactions before that)\n", chainstate.m_chain.Height() - pindexFailure->nHeight + 1, nGoodTransactions);
        return VerifyDBResult::CORRUPTED_BLOCK_DB;
    }
    if (skipped_l3_checks) {
        LogPrintf("Skipped verification of level >=3 (insufficient database cache size). Consider increasing -dbcache.\n");
    }

    // store block count as we move pindex at check level >= 4
    int block_count = chainstate.m_chain.Height() - pindex->nHeight;

    // check level 4: try reconnecting blocks
    if (nCheckLevel >= 4 && !skipped_l3_checks) {
        while (pindex != chainstate.m_chain.Tip()) {
            const int percentageDone = std::max(1, std::min(99, 100 - (int)(((double)(chainstate.m_chain.Height() - pindex->nHeight)) / (double)nCheckDepth * 50)));
            if (reportDone < percentageDone / 10) {
                // report every 10% step
                LogPrintf("Verification progress: %d%%\n", percentageDone);
                reportDone = percentageDone / 10;
            }
            m_notifications.progress(_("Verifying blocks…"), percentageDone, false);
            pindex = chainstate.m_chain.Next(pindex);
            CBlock block;
            if (!chainstate.m_blockman.ReadBlockFromDisk(block, *pindex)) {
                LogPrintf("Verification error: ReadBlockFromDisk failed at %d, hash=%s\n", pindex->nHeight, pindex->GetBlockHash().ToString());
                return VerifyDBResult::CORRUPTED_BLOCK_DB;
            }
            if (!chainstate.ConnectBlock(block, state, pindex, coins)) {
                LogPrintf("Verification error: found unconnectable block at %d, hash=%s (%s)\n", pindex->nHeight, pindex->GetBlockHash().ToString(), state.ToString());
                return VerifyDBResult::CORRUPTED_BLOCK_DB;
            }
            if (chainstate.m_chainman.m_interrupt) return VerifyDBResult::INTERRUPTED;
        }
    }

    LogPrintf("Verification: No coin database inconsistencies in last %i blocks (%i transactions)\n", block_count, nGoodTransactions);

    if (skipped_l3_checks) {
        return VerifyDBResult::SKIPPED_L3_CHECKS;
    }
    if (skipped_no_block_data) {
        return VerifyDBResult::SKIPPED_MISSING_BLOCKS;
    }
    return VerifyDBResult::SUCCESS;
}